

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O3

void pbrt::ErrorExit<int&,int>(char *fmt,int *args,int *args_1)

{
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<int&,int>(&local_30,fmt,args,args_1);
  ErrorExit((FileLoc *)0x0,local_30._M_dataplus._M_p);
}

Assistant:

[[noreturn]] inline void ErrorExit(const char *fmt, Args &&... args) {
    ErrorExit(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}